

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

bool __thiscall IRBuilder::AllowNativeArrayProfileInfo(IRBuilder *this)

{
  bool bVar1;
  BOOL BVar2;
  Func *pFVar3;
  intptr_t iVar4;
  bool local_19;
  IRBuilder *this_local;
  
  pFVar3 = Func::GetTopFunc(this->m_func);
  BVar2 = Func::HasTry(pFVar3);
  if (BVar2 == 0) {
LAB_006437a5:
    iVar4 = Func::GetWeakFuncRef(this->m_func);
    if (iVar4 != 0) {
      bVar1 = Func::HasArrayInfo(this->m_func);
      local_19 = true;
      if (!bVar1) goto LAB_006437e3;
    }
  }
  else {
    pFVar3 = Func::GetTopFunc(this->m_func);
    bVar1 = Func::DoOptimizeTry(pFVar3);
    if (bVar1) goto LAB_006437a5;
  }
  local_19 = Func::IsJitInDebugMode(this->m_func);
LAB_006437e3:
  return (bool)((local_19 ^ 0xffU) & 1);
}

Assistant:

bool
IRBuilder::AllowNativeArrayProfileInfo()
{
    return !((!(m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry()) && m_func->GetWeakFuncRef() && !m_func->HasArrayInfo()) ||
        m_func->IsJitInDebugMode());
}